

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

void __thiscall QJsonPrivate::Parser::eatBOM(Parser *this)

{
  char *pcVar1;
  
  pcVar1 = this->json;
  if ((((3 < (long)this->end - (long)pcVar1) && (*pcVar1 == -0x11)) && (pcVar1[1] == -0x45)) &&
     (pcVar1[2] == -0x41)) {
    this->json = pcVar1 + 3;
  }
  return;
}

Assistant:

void Parser::eatBOM()
{
    // eat UTF-8 byte order mark
    uchar utf8bom[3] = { 0xef, 0xbb, 0xbf };
    if (end - json > 3 &&
        (uchar)json[0] == utf8bom[0] &&
        (uchar)json[1] == utf8bom[1] &&
        (uchar)json[2] == utf8bom[2])
        json += 3;
}